

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Init(sqlite3 *db,char **pzErrMsg)

{
  uint uVar1;
  Schema *pSVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  uVar1 = db->mDbFlags;
  pSVar2 = db->aDb->pSchema;
  db->enc = pSVar2->enc;
  if (((pSVar2->schemaFlags & 1) == 0) && (iVar4 = sqlite3InitOne(db,0,pzErrMsg,0), iVar4 != 0)) {
    return iVar4;
  }
  lVar6 = (long)db->nDb;
  if (1 < lVar6) {
    lVar5 = lVar6 * 0x20 + -8;
    do {
      if (((*(byte *)(*(long *)((long)&db->aDb->zDbSName + lVar5) + 0x72) & 1) == 0) &&
         (iVar4 = sqlite3InitOne(db,(int)lVar6 + -1,pzErrMsg,0), iVar4 != 0)) {
        return iVar4;
      }
      lVar5 = lVar5 + -0x20;
      bVar3 = 2 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar3);
  }
  if ((uVar1 & 1) == 0) {
    *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xfe;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3Init(sqlite3 *db, char **pzErrMsg){
  int i, rc;
  int commit_internal = !(db->mDbFlags&DBFLAG_SchemaChange);
  
  assert( sqlite3_mutex_held(db->mutex) );
  assert( sqlite3BtreeHoldsMutex(db->aDb[0].pBt) );
  assert( db->init.busy==0 );
  ENC(db) = SCHEMA_ENC(db);
  assert( db->nDb>0 );
  /* Do the main schema first */
  if( !DbHasProperty(db, 0, DB_SchemaLoaded) ){
    rc = sqlite3InitOne(db, 0, pzErrMsg, 0);
    if( rc ) return rc;
  }
  /* All other schemas after the main schema. The "temp" schema must be last */
  for(i=db->nDb-1; i>0; i--){
    assert( i==1 || sqlite3BtreeHoldsMutex(db->aDb[i].pBt) );
    if( !DbHasProperty(db, i, DB_SchemaLoaded) ){
      rc = sqlite3InitOne(db, i, pzErrMsg, 0);
      if( rc ) return rc;
    }
  }
  if( commit_internal ){
    sqlite3CommitInternalChanges(db);
  }
  return SQLITE_OK;
}